

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathNodeSetAddNs(xmlNodeSetPtr cur,xmlNodePtr node,xmlNsPtr ns)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  xmlNodePtr *temp;
  int i;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  xmlNodeSetPtr cur_local;
  
  if ((((cur == (xmlNodeSetPtr)0x0) || (ns == (xmlNsPtr)0x0)) || (node == (xmlNodePtr)0x0)) ||
     ((ns->type != XML_NAMESPACE_DECL || (node->type != XML_ELEMENT_NODE)))) {
    return -1;
  }
  for (temp._4_4_ = 0; temp._4_4_ < cur->nodeNr; temp._4_4_ = temp._4_4_ + 1) {
    if (((cur->nodeTab[temp._4_4_] != (xmlNodePtr)0x0) &&
        (cur->nodeTab[temp._4_4_]->type == XML_NAMESPACE_DECL)) &&
       (((xmlNodePtr)cur->nodeTab[temp._4_4_]->_private == node &&
        (iVar1 = xmlStrEqual(ns->prefix,(xmlChar *)cur->nodeTab[temp._4_4_]->children), iVar1 != 0))
       )) {
      return 0;
    }
  }
  if (cur->nodeMax == 0) {
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    cur->nodeTab = ppxVar2;
    if (cur->nodeTab == (xmlNodePtr *)0x0) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"growing nodeset\n");
      return -1;
    }
    memset(cur->nodeTab,0,0x50);
    cur->nodeMax = 10;
  }
  else if (cur->nodeNr == cur->nodeMax) {
    if (9999999 < cur->nodeMax) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"growing nodeset hit limit\n");
      return -1;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)(cur->nodeMax << 1) << 3);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"growing nodeset\n");
      return -1;
    }
    cur->nodeMax = cur->nodeMax << 1;
    cur->nodeTab = ppxVar2;
  }
  pxVar3 = xmlXPathNodeSetDupNs(node,ns);
  iVar1 = cur->nodeNr;
  cur->nodeNr = iVar1 + 1;
  cur->nodeTab[iVar1] = pxVar3;
  return 0;
}

Assistant:

int
xmlXPathNodeSetAddNs(xmlNodeSetPtr cur, xmlNodePtr node, xmlNsPtr ns) {
    int i;


    if ((cur == NULL) || (ns == NULL) || (node == NULL) ||
        (ns->type != XML_NAMESPACE_DECL) ||
	(node->type != XML_ELEMENT_NODE))
	return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++) {
        if ((cur->nodeTab[i] != NULL) &&
	    (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) &&
	    (((xmlNsPtr)cur->nodeTab[i])->next == (xmlNsPtr) node) &&
	    (xmlStrEqual(ns->prefix, ((xmlNsPtr)cur->nodeTab[i])->prefix)))
	    return(0);
    }

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * (size_t) sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
        cur->nodeMax *= 2;
	cur->nodeTab = temp;
    }
    /* TODO: Check memory error. */
    cur->nodeTab[cur->nodeNr++] = xmlXPathNodeSetDupNs(node, ns);
    return(0);
}